

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O0

void vkt::tessellation::anon_unknown_0::addDefaultPrograms
               (SourceCollections *programCollection,TessPrimitiveType primitiveType,
               SpacingMode spacingMode,WindingUsage windingUsage,PointModeUsage pointModeUsage,
               bool mirrorCoords)

{
  Winding winding;
  bool bVar1;
  const_reference cVar2;
  int iVar3;
  char *pcVar4;
  ostream *poVar5;
  ProgramSources *pPVar6;
  reference pWVar7;
  const_iterator cVar8;
  string local_ac0;
  ShaderSource local_aa0;
  allocator<char> local_a71;
  string local_a70;
  string local_a50;
  int local_a30;
  int local_a2c;
  int i_1;
  int i;
  ostringstream src_3;
  int numVertices;
  _Bit_iterator_base local_898;
  _Bit_type *local_888;
  uint local_880;
  undefined1 local_878 [8];
  const_iterator usePointModeIter_1;
  ShaderSource local_848;
  allocator<char> local_819;
  string local_818;
  string local_7f8;
  string local_7d8 [32];
  ostringstream local_7b8 [8];
  ostringstream src_2;
  _Bit_iterator_base local_630;
  _Bit_type *local_620;
  uint local_618;
  undefined1 local_610 [8];
  const_iterator usePointModeIter;
  __normal_iterator<const_vkt::tessellation::Winding_*,_std::vector<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_>_>
  local_5f8;
  const_iterator windingIter;
  vector<bool,_std::allocator<bool>_> usePointModeCases;
  vector<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_> windingCases;
  ostringstream local_5a8 [8];
  ostringstream tessEvalCoordSrc;
  allocator<char> local_429;
  string local_428 [8];
  string perVertexInterfaceBlock;
  ShaderSource local_3e8;
  allocator<char> local_3b9;
  string local_3b8;
  ostringstream local_398 [8];
  ostringstream src_1;
  string local_220;
  ShaderSource local_200;
  allocator<char> local_1d1;
  string local_1d0;
  ostringstream local_1a0 [8];
  ostringstream src;
  bool mirrorCoords_local;
  PointModeUsage pointModeUsage_local;
  WindingUsage windingUsage_local;
  SpacingMode spacingMode_local;
  TessPrimitiveType primitiveType_local;
  SourceCollections *programCollection_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  pcVar4 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  poVar5 = std::operator<<((ostream *)local_1a0,pcVar4);
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"layout(location = 0) in  highp float in_v_attr;\n");
  poVar5 = std::operator<<(poVar5,"layout(location = 0) out highp float in_tc_attr;\n");
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"void main (void)\n");
  poVar5 = std::operator<<(poVar5,"{\n");
  poVar5 = std::operator<<(poVar5,"    in_tc_attr = in_v_attr;\n");
  std::operator<<(poVar5,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"vert",&local_1d1);
  pPVar6 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_1d0);
  std::__cxx11::ostringstream::str();
  glu::VertexSource::VertexSource((VertexSource *)&local_200,&local_220);
  glu::ProgramSources::operator<<(pPVar6,&local_200);
  glu::VertexSource::~VertexSource((VertexSource *)&local_200);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::__cxx11::ostringstream::ostringstream(local_398);
  pcVar4 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  poVar5 = std::operator<<((ostream *)local_398,pcVar4);
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"#extension GL_EXT_tessellation_shader : require\n");
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"layout(vertices = 1) out;\n");
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"layout(location = 0) in highp float in_tc_attr[];\n");
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"void main (void)\n");
  poVar5 = std::operator<<(poVar5,"{\n");
  poVar5 = std::operator<<(poVar5,"    gl_TessLevelInner[0] = in_tc_attr[0];\n");
  poVar5 = std::operator<<(poVar5,"    gl_TessLevelInner[1] = in_tc_attr[1];\n");
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"    gl_TessLevelOuter[0] = in_tc_attr[2];\n");
  poVar5 = std::operator<<(poVar5,"    gl_TessLevelOuter[1] = in_tc_attr[3];\n");
  poVar5 = std::operator<<(poVar5,"    gl_TessLevelOuter[2] = in_tc_attr[4];\n");
  poVar5 = std::operator<<(poVar5,"    gl_TessLevelOuter[3] = in_tc_attr[5];\n");
  std::operator<<(poVar5,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b8,"tesc",&local_3b9);
  pPVar6 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_3b8);
  std::__cxx11::ostringstream::str();
  glu::TessellationControlSource::TessellationControlSource
            ((TessellationControlSource *)&local_3e8,
             (string *)((long)&perVertexInterfaceBlock.field_2 + 8));
  glu::ProgramSources::operator<<(pPVar6,&local_3e8);
  glu::TessellationControlSource::~TessellationControlSource
            ((TessellationControlSource *)&local_3e8);
  std::__cxx11::string::~string((string *)(perVertexInterfaceBlock.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_3b8);
  std::allocator<char>::~allocator(&local_3b9);
  std::__cxx11::ostringstream::~ostringstream(local_398);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_428,"VertexData {\n    vec4 in_gs_tessCoord;\n    int  in_gs_primitiveID;\n}",
             &local_429);
  std::allocator<char>::~allocator(&local_429);
  std::__cxx11::ostringstream::ostringstream(local_5a8);
  if (mirrorCoords) {
    if (primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
      poVar5 = std::operator<<((ostream *)local_5a8,"    float x = gl_TessCoord.x;\n");
      poVar5 = std::operator<<(poVar5,"    float y = gl_TessCoord.y;\n");
      poVar5 = std::operator<<(poVar5,"    float z = gl_TessCoord.z;\n");
      poVar5 = std::operator<<(poVar5,"\n");
      poVar5 = std::operator<<(poVar5,
                               "    // Mirror one half of each outer edge onto the other half, except the endpoints (because they belong to two edges)\n"
                              );
      poVar5 = std::operator<<(poVar5,
                               "    ib_out.in_gs_tessCoord   = z == 0.0 && x > 0.5 && x != 1.0 ? vec4(1.0-x,  1.0-y,    0.0, 1.0)\n"
                              );
      poVar5 = std::operator<<(poVar5,
                               "                             : y == 0.0 && z > 0.5 && z != 1.0 ? vec4(1.0-x,    0.0,  1.0-z, 1.0)\n"
                              );
      poVar5 = std::operator<<(poVar5,
                               "                             : x == 0.0 && y > 0.5 && y != 1.0 ? vec4(  0.0,  1.0-y,  1.0-z, 1.0)\n"
                              );
      std::operator<<(poVar5,"                             : vec4(x, y, z, 0.0);\n");
    }
    else if (primitiveType == TESSPRIMITIVETYPE_QUADS) {
      poVar5 = std::operator<<((ostream *)local_5a8,"    float x = gl_TessCoord.x;\n");
      poVar5 = std::operator<<(poVar5,"    float y = gl_TessCoord.y;\n");
      poVar5 = std::operator<<(poVar5,"\n");
      poVar5 = std::operator<<(poVar5,
                               "    // Mirror one half of each outer edge onto the other half, except the endpoints (because they belong to two edges)\n"
                              );
      poVar5 = std::operator<<(poVar5,
                               "    ib_out.in_gs_tessCoord   = (x == 0.0 || x == 1.0) && y > 0.5 && y != 1.0 ? vec4(    x, 1.0-y, 0.0, 1.0)\n"
                              );
      poVar5 = std::operator<<(poVar5,
                               "                             : (y == 0.0 || y == 1.0) && x > 0.5 && x != 1.0 ? vec4(1.0-x,     y, 0.0, 1.0)\n"
                              );
      std::operator<<(poVar5,"                             : vec4(x, y, 0.0, 0.0);\n");
    }
    else {
      if (primitiveType != TESSPRIMITIVETYPE_ISOLINES) goto LAB_00dcdb5e;
      poVar5 = std::operator<<((ostream *)local_5a8,"    float x = gl_TessCoord.x;\n");
      poVar5 = std::operator<<(poVar5,"    float y = gl_TessCoord.y;\n");
      poVar5 = std::operator<<(poVar5,"\n");
      poVar5 = std::operator<<(poVar5,
                               "    // Mirror one half of each outer edge onto the other half\n");
      poVar5 = std::operator<<(poVar5,
                               "    ib_out.in_gs_tessCoord   = (x == 0.0 || x == 1.0) && y > 0.5 ? vec4(x, 1.0-y, 0.0, 1.0)\n"
                              );
      std::operator<<(poVar5,"                             : vec4(x, y, 0.0, 0.0);\n");
    }
  }
  else {
    std::operator<<((ostream *)local_5a8,"    ib_out.in_gs_tessCoord   = vec4(gl_TessCoord, 0.0);\n"
                   );
  }
  getWindingCases((vector<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_> *
                  )&usePointModeCases.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_end_of_storage,windingUsage);
  getUsePointModeCases((vector<bool,_std::allocator<bool>_> *)&windingIter,pointModeUsage);
  local_5f8._M_current =
       (Winding *)
       std::vector<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_>::begin
                 ((vector<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_> *
                  )&usePointModeCases.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_end_of_storage);
  while( true ) {
    usePointModeIter.super__Bit_iterator_base._8_8_ =
         std::vector<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_>::end
                   ((vector<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_>
                     *)&usePointModeCases.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_end_of_storage);
    bVar1 = __gnu_cxx::operator!=
                      (&local_5f8,
                       (__normal_iterator<const_vkt::tessellation::Winding_*,_std::vector<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_>_>
                        *)&usePointModeIter.super__Bit_iterator_base._M_offset);
    if (!bVar1) break;
    cVar8 = std::vector<bool,_std::allocator<bool>_>::begin
                      ((vector<bool,_std::allocator<bool>_> *)&windingIter);
    local_620 = cVar8.super__Bit_iterator_base._M_p;
    local_618 = cVar8.super__Bit_iterator_base._M_offset;
    local_610 = (undefined1  [8])local_620;
    usePointModeIter.super__Bit_iterator_base._M_p._0_4_ = local_618;
    while( true ) {
      cVar8 = std::vector<bool,_std::allocator<bool>_>::end
                        ((vector<bool,_std::allocator<bool>_> *)&windingIter);
      local_630._M_p = cVar8.super__Bit_iterator_base._M_p;
      local_630._M_offset = cVar8.super__Bit_iterator_base._M_offset;
      bVar1 = std::operator!=((_Bit_iterator_base *)local_610,&local_630);
      if (!bVar1) break;
      std::__cxx11::ostringstream::ostringstream(local_7b8);
      pcVar4 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
      poVar5 = std::operator<<((ostream *)local_7b8,pcVar4);
      poVar5 = std::operator<<(poVar5,"\n");
      poVar5 = std::operator<<(poVar5,"#extension GL_EXT_tessellation_shader : require\n");
      poVar5 = std::operator<<(poVar5,"\n");
      poVar5 = std::operator<<(poVar5,"layout(");
      pcVar4 = getTessPrimitiveTypeShaderName(primitiveType);
      poVar5 = std::operator<<(poVar5,pcVar4);
      poVar5 = std::operator<<(poVar5,", ");
      pcVar4 = getSpacingModeShaderName(spacingMode);
      poVar5 = std::operator<<(poVar5,pcVar4);
      poVar5 = std::operator<<(poVar5,", ");
      pWVar7 = __gnu_cxx::
               __normal_iterator<const_vkt::tessellation::Winding_*,_std::vector<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_>_>
               ::operator*(&local_5f8);
      pcVar4 = getWindingShaderName(*pWVar7);
      poVar5 = std::operator<<(poVar5,pcVar4);
      cVar2 = std::_Bit_const_iterator::operator*((_Bit_const_iterator *)local_610);
      pcVar4 = "";
      if (cVar2) {
        pcVar4 = ", point_mode";
      }
      poVar5 = std::operator<<(poVar5,pcVar4);
      poVar5 = std::operator<<(poVar5,") in;\n");
      poVar5 = std::operator<<(poVar5,"\n");
      poVar5 = std::operator<<(poVar5,"layout(location = 0) out ");
      poVar5 = std::operator<<(poVar5,local_428);
      poVar5 = std::operator<<(poVar5," ib_out;\n");
      poVar5 = std::operator<<(poVar5,"\n");
      poVar5 = std::operator<<(poVar5,"void main (void)\n");
      poVar5 = std::operator<<(poVar5,"{\n");
      std::__cxx11::ostringstream::str();
      poVar5 = std::operator<<(poVar5,local_7d8);
      poVar5 = std::operator<<(poVar5,"    ib_out.in_gs_primitiveID = gl_PrimitiveID;\n");
      std::operator<<(poVar5,"}\n");
      std::__cxx11::string::~string(local_7d8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_818,"tese",&local_819);
      pWVar7 = __gnu_cxx::
               __normal_iterator<const_vkt::tessellation::Winding_*,_std::vector<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_>_>
               ::operator*(&local_5f8);
      winding = *pWVar7;
      cVar2 = std::_Bit_const_iterator::operator*((_Bit_const_iterator *)local_610);
      getProgramName(&local_7f8,&local_818,winding,cVar2);
      pPVar6 = ::vk::ProgramCollection<glu::ProgramSources>::add
                         (&programCollection->glslSources,&local_7f8);
      std::__cxx11::ostringstream::str();
      glu::TessellationEvaluationSource::TessellationEvaluationSource
                ((TessellationEvaluationSource *)&local_848,
                 (string *)&usePointModeIter_1.super__Bit_iterator_base._M_offset);
      glu::ProgramSources::operator<<(pPVar6,&local_848);
      glu::TessellationEvaluationSource::~TessellationEvaluationSource
                ((TessellationEvaluationSource *)&local_848);
      std::__cxx11::string::~string
                ((string *)&usePointModeIter_1.super__Bit_iterator_base._M_offset);
      std::__cxx11::string::~string((string *)&local_7f8);
      std::__cxx11::string::~string((string *)&local_818);
      std::allocator<char>::~allocator(&local_819);
      std::__cxx11::ostringstream::~ostringstream(local_7b8);
      std::_Bit_const_iterator::operator++((_Bit_const_iterator *)local_610);
    }
    __gnu_cxx::
    __normal_iterator<const_vkt::tessellation::Winding_*,_std::vector<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_>_>
    ::operator++(&local_5f8);
  }
  cVar8 = std::vector<bool,_std::allocator<bool>_>::begin
                    ((vector<bool,_std::allocator<bool>_> *)&windingIter);
  local_888 = cVar8.super__Bit_iterator_base._M_p;
  local_880 = cVar8.super__Bit_iterator_base._M_offset;
  local_878 = (undefined1  [8])local_888;
  usePointModeIter_1.super__Bit_iterator_base._M_p._0_4_ = local_880;
  while( true ) {
    cVar8 = std::vector<bool,_std::allocator<bool>_>::end
                      ((vector<bool,_std::allocator<bool>_> *)&windingIter);
    local_898._M_p = cVar8.super__Bit_iterator_base._M_p;
    local_898._M_offset = cVar8.super__Bit_iterator_base._M_offset;
    bVar1 = std::operator!=((_Bit_iterator_base *)local_878,&local_898);
    if (!bVar1) break;
    cVar2 = std::_Bit_const_iterator::operator*((_Bit_const_iterator *)local_878);
    iVar3 = numVerticesPerPrimitive(primitiveType,cVar2);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&i_1);
    pcVar4 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
    poVar5 = std::operator<<((ostream *)&i_1,pcVar4);
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"#extension GL_EXT_geometry_shader : require\n");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"layout(");
    cVar2 = std::_Bit_const_iterator::operator*((_Bit_const_iterator *)local_878);
    pcVar4 = getGeometryShaderInputPrimitiveTypeShaderName(primitiveType,cVar2);
    poVar5 = std::operator<<(poVar5,pcVar4);
    poVar5 = std::operator<<(poVar5,") in;\n");
    poVar5 = std::operator<<(poVar5,"layout(");
    cVar2 = std::_Bit_const_iterator::operator*((_Bit_const_iterator *)local_878);
    pcVar4 = getGeometryShaderOutputPrimitiveTypeShaderName(primitiveType,cVar2);
    poVar5 = std::operator<<(poVar5,pcVar4);
    poVar5 = std::operator<<(poVar5,", max_vertices = ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
    poVar5 = std::operator<<(poVar5,") out;\n");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"layout(location = 0) in ");
    poVar5 = std::operator<<(poVar5,local_428);
    poVar5 = std::operator<<(poVar5," ib_in[];\n");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"struct PerPrimitive {\n");
    poVar5 = std::operator<<(poVar5,"    int  patchPrimitiveID;\n");
    poVar5 = std::operator<<(poVar5,"    int  primitiveID;\n");
    poVar5 = std::operator<<(poVar5,"    vec4 tessCoord[3];\n");
    poVar5 = std::operator<<(poVar5,"};\n");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,
                             "layout(set = 0, binding = 0, std430) coherent restrict buffer Output {\n"
                            );
    poVar5 = std::operator<<(poVar5,"    int          numPrimitives;\n");
    poVar5 = std::operator<<(poVar5,"    PerPrimitive primitive[];\n");
    poVar5 = std::operator<<(poVar5,"} sb_out;\n");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"void main (void)\n");
    poVar5 = std::operator<<(poVar5,"{\n");
    poVar5 = std::operator<<(poVar5,"    int index = atomicAdd(sb_out.numPrimitives, 1);\n");
    poVar5 = std::operator<<(poVar5,
                             "    sb_out.primitive[index].patchPrimitiveID = ib_in[0].in_gs_primitiveID;\n"
                            );
    std::operator<<(poVar5,"    sb_out.primitive[index].primitiveID      = index;\n");
    for (local_a2c = 0; local_a2c < iVar3; local_a2c = local_a2c + 1) {
      poVar5 = std::operator<<((ostream *)&i_1,"    sb_out.primitive[index].tessCoord[");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_a2c);
      poVar5 = std::operator<<(poVar5,"]     = ib_in[");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_a2c);
      std::operator<<(poVar5,"].in_gs_tessCoord;\n");
    }
    for (local_a30 = 0; local_a30 < iVar3; local_a30 = local_a30 + 1) {
      poVar5 = std::operator<<((ostream *)&i_1,"\n");
      poVar5 = std::operator<<(poVar5,"    gl_Position = vec4(0.0);\n");
      std::operator<<(poVar5,"    EmitVertex();\n");
    }
    std::operator<<((ostream *)&i_1,"}\n");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a70,"geom",&local_a71);
    cVar2 = std::_Bit_const_iterator::operator*((_Bit_const_iterator *)local_878);
    getProgramName(&local_a50,&local_a70,cVar2);
    pPVar6 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&programCollection->glslSources,&local_a50);
    std::__cxx11::ostringstream::str();
    glu::GeometrySource::GeometrySource((GeometrySource *)&local_aa0,&local_ac0);
    glu::ProgramSources::operator<<(pPVar6,&local_aa0);
    glu::GeometrySource::~GeometrySource((GeometrySource *)&local_aa0);
    std::__cxx11::string::~string((string *)&local_ac0);
    std::__cxx11::string::~string((string *)&local_a50);
    std::__cxx11::string::~string((string *)&local_a70);
    std::allocator<char>::~allocator(&local_a71);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&i_1);
    std::_Bit_const_iterator::operator++((_Bit_const_iterator *)local_878);
  }
  std::vector<bool,_std::allocator<bool>_>::~vector
            ((vector<bool,_std::allocator<bool>_> *)&windingIter);
  std::vector<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_>::~vector
            ((vector<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_> *)
             &usePointModeCases.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_end_of_storage);
LAB_00dcdb5e:
  std::__cxx11::ostringstream::~ostringstream(local_5a8);
  std::__cxx11::string::~string(local_428);
  return;
}

Assistant:

void addDefaultPrograms (vk::SourceCollections&  programCollection,
						 const TessPrimitiveType primitiveType,
						 const SpacingMode       spacingMode,
						 const WindingUsage      windingUsage,
						 const PointModeUsage    pointModeUsage,
						 const bool				 mirrorCoords = false)
{
	// Vertex shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "\n"
			<< "layout(location = 0) in  highp float in_v_attr;\n"
			<< "layout(location = 0) out highp float in_tc_attr;\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    in_tc_attr = in_v_attr;\n"
			<< "}\n";

		programCollection.glslSources.add("vert") << glu::VertexSource(src.str());
	}

	// Tessellation control shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "#extension GL_EXT_tessellation_shader : require\n"
			<< "\n"
			<< "layout(vertices = 1) out;\n"
			<< "\n"
			<< "layout(location = 0) in highp float in_tc_attr[];\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    gl_TessLevelInner[0] = in_tc_attr[0];\n"
			<< "    gl_TessLevelInner[1] = in_tc_attr[1];\n"
			<< "\n"
			<< "    gl_TessLevelOuter[0] = in_tc_attr[2];\n"
			<< "    gl_TessLevelOuter[1] = in_tc_attr[3];\n"
			<< "    gl_TessLevelOuter[2] = in_tc_attr[4];\n"
			<< "    gl_TessLevelOuter[3] = in_tc_attr[5];\n"
			<< "}\n";

		programCollection.glslSources.add("tesc") << glu::TessellationControlSource(src.str());
	}

	const std::string perVertexInterfaceBlock = \
		"VertexData {\n"					// no in/out qualifier
		"    vec4 in_gs_tessCoord;\n"		// w component is used by mirroring test
		"    int  in_gs_primitiveID;\n"
		"}";								// no newline nor semicolon

	// Alternative tess coordinates handling code
	std::ostringstream tessEvalCoordSrc;
	if (mirrorCoords)
		switch (primitiveType)
		{
			case TESSPRIMITIVETYPE_TRIANGLES:
				tessEvalCoordSrc << "    float x = gl_TessCoord.x;\n"
								 << "    float y = gl_TessCoord.y;\n"
								 << "    float z = gl_TessCoord.z;\n"
								 << "\n"
								 << "    // Mirror one half of each outer edge onto the other half, except the endpoints (because they belong to two edges)\n"
								 << "    ib_out.in_gs_tessCoord   = z == 0.0 && x > 0.5 && x != 1.0 ? vec4(1.0-x,  1.0-y,    0.0, 1.0)\n"
								 << "                             : y == 0.0 && z > 0.5 && z != 1.0 ? vec4(1.0-x,    0.0,  1.0-z, 1.0)\n"
								 << "                             : x == 0.0 && y > 0.5 && y != 1.0 ? vec4(  0.0,  1.0-y,  1.0-z, 1.0)\n"
								 << "                             : vec4(x, y, z, 0.0);\n";
				break;
			case TESSPRIMITIVETYPE_QUADS:
				tessEvalCoordSrc << "    float x = gl_TessCoord.x;\n"
								 << "    float y = gl_TessCoord.y;\n"
								 << "\n"
								 << "    // Mirror one half of each outer edge onto the other half, except the endpoints (because they belong to two edges)\n"
								 << "    ib_out.in_gs_tessCoord   = (x == 0.0 || x == 1.0) && y > 0.5 && y != 1.0 ? vec4(    x, 1.0-y, 0.0, 1.0)\n"
								 << "                             : (y == 0.0 || y == 1.0) && x > 0.5 && x != 1.0 ? vec4(1.0-x,     y, 0.0, 1.0)\n"
								 << "                             : vec4(x, y, 0.0, 0.0);\n";
				break;
			case TESSPRIMITIVETYPE_ISOLINES:
				tessEvalCoordSrc << "    float x = gl_TessCoord.x;\n"
								 << "    float y = gl_TessCoord.y;\n"
								 << "\n"
								 << "    // Mirror one half of each outer edge onto the other half\n"
								 << "    ib_out.in_gs_tessCoord   = (x == 0.0 || x == 1.0) && y > 0.5 ? vec4(x, 1.0-y, 0.0, 1.0)\n"
								 << "                             : vec4(x, y, 0.0, 0.0);\n";
				break;
			default:
				DE_ASSERT(false);
				return;
		}
	else
		tessEvalCoordSrc << "    ib_out.in_gs_tessCoord   = vec4(gl_TessCoord, 0.0);\n";

	const std::vector<Winding> windingCases      = getWindingCases(windingUsage);
	const std::vector<bool>    usePointModeCases = getUsePointModeCases(pointModeUsage);

	for (std::vector<Winding>::const_iterator windingIter = windingCases.begin(); windingIter != windingCases.end(); ++windingIter)
	for (std::vector<bool>::const_iterator usePointModeIter = usePointModeCases.begin(); usePointModeIter != usePointModeCases.end(); ++usePointModeIter)
	{
		// Tessellation evaluation shader
		{
			std::ostringstream src;
			src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
				<< "#extension GL_EXT_tessellation_shader : require\n"
				<< "\n"
				<< "layout(" << getTessPrimitiveTypeShaderName(primitiveType) << ", "
							 << getSpacingModeShaderName(spacingMode) << ", "
							 << getWindingShaderName(*windingIter)
							 << (*usePointModeIter ? ", point_mode" : "") << ") in;\n"
				<< "\n"
				<< "layout(location = 0) out " << perVertexInterfaceBlock << " ib_out;\n"
				<< "\n"
				<< "void main (void)\n"
				<< "{\n"
				<< tessEvalCoordSrc.str()
				<< "    ib_out.in_gs_primitiveID = gl_PrimitiveID;\n"
				<< "}\n";

			programCollection.glslSources.add(getProgramName("tese", *windingIter, *usePointModeIter)) << glu::TessellationEvaluationSource(src.str());
		}
	}  // for windingNdx, usePointModeNdx

	// Geometry shader: data is captured here.
	{
		for (std::vector<bool>::const_iterator usePointModeIter = usePointModeCases.begin(); usePointModeIter != usePointModeCases.end(); ++usePointModeIter)
		{
			const int numVertices = numVerticesPerPrimitive(primitiveType, *usePointModeIter);  // Primitives that the tessellated patch comprises of.

			std::ostringstream src;
			src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
				<< "#extension GL_EXT_geometry_shader : require\n"
				<< "\n"
				<< "layout(" << getGeometryShaderInputPrimitiveTypeShaderName(primitiveType, *usePointModeIter) << ") in;\n"
				<< "layout(" << getGeometryShaderOutputPrimitiveTypeShaderName(primitiveType, *usePointModeIter) << ", max_vertices = " << numVertices << ") out;\n"
				<< "\n"
				<< "layout(location = 0) in " << perVertexInterfaceBlock << " ib_in[];\n"
				<< "\n"
				<< "struct PerPrimitive {\n"
				<< "    int  patchPrimitiveID;\n"
				<< "    int  primitiveID;\n"
				<< "    vec4 tessCoord[3];\n"
				<< "};\n"
				<< "\n"
				<< "layout(set = 0, binding = 0, std430) coherent restrict buffer Output {\n"
				<< "    int          numPrimitives;\n"
				<< "    PerPrimitive primitive[];\n"
				<< "} sb_out;\n"
				<< "\n"
				<< "void main (void)\n"
				<< "{\n"
				<< "    int index = atomicAdd(sb_out.numPrimitives, 1);\n"
				<< "    sb_out.primitive[index].patchPrimitiveID = ib_in[0].in_gs_primitiveID;\n"
				<< "    sb_out.primitive[index].primitiveID      = index;\n";
			for (int i = 0; i < numVertices; ++i)
				src << "    sb_out.primitive[index].tessCoord[" << i << "]     = ib_in[" << i << "].in_gs_tessCoord;\n";
			for (int i = 0; i < numVertices; ++i)
				src << "\n"
					<< "    gl_Position = vec4(0.0);\n"
					<< "    EmitVertex();\n";
			src << "}\n";

			programCollection.glslSources.add(getProgramName("geom", *usePointModeIter)) << glu::GeometrySource(src.str());
		}
	}
}